

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall
Parser_modelWithInvalidElement_Test::~Parser_modelWithInvalidElement_Test
          (Parser_modelWithInvalidElement_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Parser, modelWithInvalidElement)
{
    const std::string in1 =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"bilbo\">\n"
        "  <hobbit/>\n"
        "</model>\n";
    const std::vector<std::string> expectedIssues1 = {
        "Model 'bilbo' has an invalid child element 'hobbit'.",
    };
    const std::string in2 =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"\">\n"
        "  <hobbit/>\n"
        "</model>\n";
    const std::vector<std::string> expectedIssues2 = {
        "Model '' has an invalid child element 'hobbit'.",
    };

    libcellml::ParserPtr p = libcellml::Parser::create();
    p->parseModel(in1);
    EXPECT_EQ_ISSUES(expectedIssues1, p);

    p->parseModel(in2);
    EXPECT_EQ_ISSUES(expectedIssues2, p);
}